

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O2

int run_test_tcp_close_reset_client(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  uv_tcp_t *in_RSI;
  char *pcVar3;
  
  ::loop = (uv_loop_t *)uv_default_loop();
  start_server(::loop,in_RSI);
  client_close = 1;
  shutdown_before_close = 0;
  do_connect(::loop,in_RSI);
  if (write_cb_called == 0) {
    if (close_cb_called == 0) {
      if (shutdown_cb_called == 0) {
        iVar1 = uv_run(::loop,0);
        if (iVar1 == 0) {
          if (write_cb_called == 4) {
            if (close_cb_called == 1) {
              if (shutdown_cb_called == 0) {
                loop = (uv_loop_t *)uv_default_loop();
                close_loop(loop);
                uVar2 = uv_default_loop();
                iVar1 = uv_loop_close(uVar2);
                if (iVar1 == 0) {
                  return 0;
                }
                pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                uVar2 = 0xcf;
              }
              else {
                pcVar3 = "shutdown_cb_called == 0";
                uVar2 = 0xcd;
              }
            }
            else {
              pcVar3 = "close_cb_called == 1";
              uVar2 = 0xcc;
            }
          }
          else {
            pcVar3 = "write_cb_called == 4";
            uVar2 = 0xcb;
          }
        }
        else {
          pcVar3 = "r == 0";
          uVar2 = 0xc9;
        }
      }
      else {
        pcVar3 = "shutdown_cb_called == 0";
        uVar2 = 0xc6;
      }
    }
    else {
      pcVar3 = "close_cb_called == 0";
      uVar2 = 0xc5;
    }
  }
  else {
    pcVar3 = "write_cb_called == 0";
    uVar2 = 0xc4;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-reset.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_close_reset_client) {
  int r;

  loop = uv_default_loop();

  start_server(loop, &tcp_server);

  client_close = 1;
  shutdown_before_close = 0;

  do_connect(loop, &tcp_client);

  ASSERT(write_cb_called == 0);
  ASSERT(close_cb_called == 0);
  ASSERT(shutdown_cb_called == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(write_cb_called == 4);
  ASSERT(close_cb_called == 1);
  ASSERT(shutdown_cb_called == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}